

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::Max::backward_impl
          (Max *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Tensor t;
  FMaxBackwardInv local_e9;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_e8;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_d0;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_b8;
  CwiseBinaryOp<cnn::FMaxBackwardInv,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_a0;
  undefined1 local_68 [48];
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_38;
  
  if (i < 2) {
    local_68._32_4_ = (dEdxi->d).bd;
    local_68._40_8_ = (this->super_Node).aux_mem;
    local_68._0_8_ = *(undefined8 *)(dEdxi->d).d;
    local_68._8_8_ = *(undefined8 *)((dEdxi->d).d + 2);
    local_68._16_8_ = *(undefined8 *)((dEdxi->d).d + 4);
    local_68._24_8_ = *(undefined8 *)((dEdxi->d).d + 6);
    local_38.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
    super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
    if (i == 0) {
      Tensor::vec(&local_b8,(Tensor *)local_68);
      Tensor::vec(&local_d0,dEdf);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      cwiseProduct<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_a0,
                 (MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
                 &local_b8,
                 (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_d0);
      Tensor::vec(&local_e8,dEdxi);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator+=((MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
                 &local_e8,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)&local_a0);
    }
    else {
      Tensor::vec(&local_b8,(Tensor *)local_68);
      Tensor::vec(&local_d0,dEdf);
      Eigen::
      CwiseBinaryOp<cnn::FMaxBackwardInv,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
      ::CwiseBinaryOp(&local_a0,&local_b8,&local_d0,&local_e9);
      Tensor::vec(&local_e8,dEdxi);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator+=((MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
                 &local_e8,
                 (MatrixBase<Eigen::CwiseBinaryOp<cnn::FMaxBackwardInv,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)&local_a0);
    }
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_38);
    return;
  }
  __assert_fail("i < 2",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                ,0x17d,
                "virtual void cnn::Max::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
               );
}

Assistant:

void Max::backward_impl(const vector<const Tensor*>& xs,
                   const Tensor& fx,
                   const Tensor& dEdf,
                   unsigned i,
                   Tensor& dEdxi) const {
  assert(i < 2);
#ifdef HAVE_CUDA
  throw std::runtime_error("Max not yet implemented for CUDA");
#else
  const Tensor t(dEdxi.d, static_cast<float*>(aux_mem));
  if (i == 0) {
    dEdxi.vec() += t.vec().cwiseProduct(dEdf.vec());
  } else {
    dEdxi.vec() += t.vec().binaryExpr(dEdf.vec(), FMaxBackwardInv());
  }
#endif
}